

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Generic.cpp
# Opt level: O2

bool SRUP_MSG_GENERIC::ValidMessageType(uint8_t *msgtype)

{
  return true;
}

Assistant:

bool SRUP_MSG_GENERIC::ValidMessageType (const uint8_t *msgtype)
{
    return ((*msgtype == SRUP::SRUP_MESSAGE_TYPE_INITIATE) or
        (*msgtype == SRUP::SRUP_MESSAGE_TYPE_GENERIC) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_RESPONSE) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_ACTIVATE) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_DATA) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_ACTION) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_ID_REQUEST) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_OBSERVE_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_DEREGISTER_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_OBS_JOIN_RESP) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_HM_JOIN_RESP) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_OBS_JOIN_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_JOIN_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_TERMINATE_CMD) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_HM_JOIN_REQ) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_JOIN_CMD) or
        (*msgtype != SRUP::SRUP_MESSAGE_TYPE_RESIGN_REQUEST) 
    );
}